

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::operator[](json *this,string *name)

{
  bool bVar1;
  json_invalid_key_exception *this_00;
  pointer ppVar2;
  type pjVar3;
  json_exception *this_01;
  char *json_type_name;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  string *name_local;
  json *this_local;
  
  i._M_node = (_Base_ptr)name;
  if (this->m_type != object_e) {
    this_01 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_01,not_an_object_e,json_type_name);
    __cxa_throw(this_01,&json_exception::typeinfo,json_exception::~json_exception);
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
       ::find(&(this->m_value).u_object,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
       ::end(&(this->m_value).u_object);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
             ::operator->(&local_20);
    pjVar3 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                       (&ppVar2->second);
    return pjVar3;
  }
  this_00 = (json_invalid_key_exception *)__cxa_allocate_exception(0xd8);
  json_invalid_key_exception::json_invalid_key_exception(this_00,invalid_key_e,(string *)i._M_node);
  __cxa_throw(this_00,&json_invalid_key_exception::typeinfo,
              json_invalid_key_exception::~json_invalid_key_exception);
}

Assistant:

const json &json::operator[](const string &name) const
{
    if (m_type == object_e)
    {
        auto i = m_value.u_object.find(name);
        if (i == m_value.u_object.end())
        {
            throw json_invalid_key_exception(json_exception::invalid_key_e, name);
        }
        else
        {
            return *(i->second);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}